

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::EmbeddingLayerParams::SerializeWithCachedSizes
          (EmbeddingLayerParams *this,CodedOutputStream *output)

{
  if (this->inputdim_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->inputdim_,output);
  }
  if (this->outputchannels_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->outputchannels_,output);
  }
  if (this->hasbias_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(10,true,output);
  }
  if (this->weights_ != (WeightParams *)0x0 &&
      this != (EmbeddingLayerParams *)&_EmbeddingLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x14,&this->weights_->super_MessageLite,output);
  }
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (EmbeddingLayerParams *)&_EmbeddingLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x15,&this->bias_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void EmbeddingLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.EmbeddingLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 inputDim = 1;
  if (this->inputdim() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->inputdim(), output);
  }

  // uint64 outputChannels = 2;
  if (this->outputchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->outputchannels(), output);
  }

  // bool hasBias = 10;
  if (this->hasbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->hasbias(), output);
  }

  // .CoreML.Specification.WeightParams weights = 20;
  if (this->has_weights()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, *this->weights_, output);
  }

  // .CoreML.Specification.WeightParams bias = 21;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      21, *this->bias_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.EmbeddingLayerParams)
}